

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  bool bVar1;
  uint8_t *puVar2;
  LogMessage *other;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  CodedOutputStream *local_10;
  CodedOutputStream *this_local;
  
  local_10 = this;
  puVar2 = EpsCopyOutputStream::FlushAndResetBuffer(&this->impl_,this->cur_);
  this->cur_ = puVar2;
  local_49 = 0;
  if (this->cur_ == (uint8_t *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x43c);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: cur_: ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  bVar1 = EpsCopyOutputStream::HadError(&this->impl_);
  return bVar1;
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    GOOGLE_DCHECK(cur_);
    return impl_.HadError();
  }